

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_nextInstanceWithSameType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long *plVar1;
  long *plVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  plVar1 = (long *)*arguments;
  if (((ulong)plVar1 & 0xf) == 0 && plVar1 != (long *)0x0) {
    plVar2 = plVar1 + -2;
    do {
      plVar2 = (long *)*plVar2;
      if (plVar2 == (long *)0x0) {
        return 0;
      }
    } while (plVar2[2] != *plVar1);
    plVar2 = plVar2 + 2;
  }
  else {
    plVar2 = (long *)0x0;
  }
  return (sysbvm_tuple_t)plVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_nextInstanceWithSameType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t object = arguments[0];
    if(!sysbvm_tuple_isNonNullPointer(object))
        return SYSBVM_NULL_TUPLE;

    sysbvm_tuple_header_t *objectHeader = (sysbvm_tuple_header_t*)object;
    sysbvm_tuple_t expectedType = objectHeader->typePointer;

    sysbvm_heap_mallocObjectHeader_t *objectPreheader = (sysbvm_heap_mallocObjectHeader_t*)object - 1;
    sysbvm_heap_mallocObjectHeader_t *nextObject = objectPreheader->next;
    while(nextObject && ((sysbvm_tuple_header_t *)(nextObject + 1))->typePointer != expectedType)
        nextObject = nextObject->next;
    
    if(!nextObject)
        return SYSBVM_NULL_TUPLE;

    return (sysbvm_tuple_t)(nextObject + 1);
}